

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_decoder.cc
# Opt level: O0

int __thiscall
webrtc::AudioDecoder::DecodeRedundant
          (AudioDecoder *this,uint8_t *encoded,size_t encoded_len,int sample_rate_hz,
          size_t max_decoded_bytes,int16_t *decoded,SpeechType *speech_type)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  int duration;
  undefined1 local_58 [8];
  TraceEndOnScopeClose trace_event_unique_profileScope36;
  int16_t *decoded_local;
  size_t max_decoded_bytes_local;
  int sample_rate_hz_local;
  size_t encoded_len_local;
  uint8_t *encoded_local;
  AudioDecoder *this_local;
  
  trace_event_unique_profileScope36.data_.name = (char *)decoded;
  if (DecodeRedundant::trace_event_unique_catstatic36 == (uchar *)0x0) {
    DecodeRedundant::trace_event_unique_catstatic36 = EventTracer::GetCategoryEnabled("webrtc");
  }
  trace_event_internal::TraceEndOnScopeClose::TraceEndOnScopeClose((TraceEndOnScopeClose *)local_58)
  ;
  if (*DecodeRedundant::trace_event_unique_catstatic36 != '\0') {
    trace_event_internal::AddTraceEvent
              ('B',DecodeRedundant::trace_event_unique_catstatic36,"AudioDecoder::DecodeRedundant",0
               ,'\0');
    trace_event_internal::TraceEndOnScopeClose::Initialize
              ((TraceEndOnScopeClose *)local_58,DecodeRedundant::trace_event_unique_catstatic36,
               "AudioDecoder::DecodeRedundant");
  }
  iVar1 = (*this->_vptr_AudioDecoder[8])(this,encoded,encoded_len);
  if (-1 < iVar1) {
    iVar2 = (*this->_vptr_AudioDecoder[0xb])();
    uVar3 = (long)iVar1 * CONCAT44(extraout_var,iVar2) * 2;
    if (max_decoded_bytes <= uVar3 && uVar3 - max_decoded_bytes != 0) {
      this_local._4_4_ = -1;
      goto LAB_001eb429;
    }
  }
  this_local._4_4_ =
       (*this->_vptr_AudioDecoder[0xd])
                 (this,encoded,encoded_len,(ulong)(uint)sample_rate_hz,
                  trace_event_unique_profileScope36.data_.name,speech_type);
LAB_001eb429:
  trace_event_internal::TraceEndOnScopeClose::~TraceEndOnScopeClose
            ((TraceEndOnScopeClose *)local_58);
  return this_local._4_4_;
}

Assistant:

int AudioDecoder::DecodeRedundant(const uint8_t* encoded, size_t encoded_len,
                                  int sample_rate_hz, size_t max_decoded_bytes,
                                  int16_t* decoded, SpeechType* speech_type) {
  TRACE_EVENT0("webrtc", "AudioDecoder::DecodeRedundant");
  int duration = PacketDurationRedundant(encoded, encoded_len);
  if (duration >= 0 &&
      duration * Channels() * sizeof(int16_t) > max_decoded_bytes) {
    return -1;
  }
  return DecodeRedundantInternal(encoded, encoded_len, sample_rate_hz, decoded,
                                 speech_type);
}